

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

Arg * __thiscall TCLAP::Arg::shortID(Arg *this,string *valueId)

{
  bool bVar1;
  char cVar2;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [39];
  allocator local_139;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [54];
  allocator local_22;
  undefined1 local_21;
  string *valueId_local;
  Arg *this_local;
  string *id;
  
  local_21 = 0;
  valueId_local = valueId;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  bVar1 = std::operator!=(valueId + 8,"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(local_58,local_78);
    std::__cxx11::string::operator=((string *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    nameStartString_abi_cxx11_();
    std::operator+(local_98,local_b8);
    std::__cxx11::string::operator=((string *)this,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_b8);
  }
  if (((byte)valueId[0x90] & 1) != 0) {
    cVar2 = delimiter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,1,cVar2,&local_139);
    std::operator+(local_118,(char *)local_138);
    std::operator+(local_f8,local_118);
    std::operator+(local_d8,(char *)local_f8);
    std::__cxx11::string::operator+=((string *)this,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if (((byte)valueId[0x68] & 1) == 0) {
    std::operator+((char *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[");
    std::operator+(local_160,(char *)local_180);
    std::__cxx11::string::operator=((string *)this,(string *)local_160);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string(local_180);
  }
  return this;
}

Assistant:

inline std::string Arg::shortID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
		id = Arg::flagStartString() + _flag;
	else
		id = Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId  + ">";

	if ( !_required )
		id = "[" + id + "]";

	return id;
}